

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

bool has_phong_mat(aiScene *scene)

{
  ulong in_RAX;
  ulong uVar1;
  float shininess;
  undefined8 uStack_28;
  
  if (scene->mNumMaterials == 0) {
    return false;
  }
  uVar1 = 0;
  uStack_28 = in_RAX;
  do {
    uStack_28 = uStack_28 & 0xffffffff;
    aiGetMaterialFloatArray
              (scene->mMaterials[uVar1],"$mat.shininess",0,0,(ai_real *)((long)&uStack_28 + 4),
               (uint *)0x0);
    if (0.0 < uStack_28._4_4_) {
      return 0.0 < uStack_28._4_4_;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 < scene->mNumMaterials);
  return 0.0 < uStack_28._4_4_;
}

Assistant:

bool has_phong_mat(const aiScene* scene)
{
    // just search for any material with a shininess exponent
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        float shininess = 0;
        mat->Get(AI_MATKEY_SHININESS, shininess);
        if (shininess > 0) {
            return true;
        }
    }
    return false;
}